

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstate_tests.cpp
# Opt level: O3

void __thiscall
validation_chainstate_tests::chainstate_update_tip::test_method(chainstate_update_tip *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  MessageStartChars MVar4;
  pointer ppCVar5;
  uint256 *puVar6;
  pointer ppCVar7;
  string_view source_file;
  path leveldb_name;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Chainstate *pCVar13;
  Logger *pLVar14;
  CCoinsViewCache *this_00;
  Chainstate *pCVar15;
  Chainstate **ppCVar16;
  CChainParams *consensusParams;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  long *plVar18;
  CBlockIndex *pCVar19;
  char *pcVar20;
  iterator pvVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  iterator pvVar23;
  iterator in_R9;
  CBlockIndex *pCVar24;
  long in_FS_OFFSET;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  const_string file;
  const_string file_00;
  initializer_list<unsigned_short> __l;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  string_view str;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  shared_ptr<const_CBlock> pblock;
  shared_ptr<const_CBlock> pblock_00;
  string_view logging_function;
  check_type cVar35;
  _Alloc_hider _Var33;
  _Alloc_hider _Var34;
  ChainstateManager *this_02;
  CBlock *block;
  CBlock *this_03;
  undefined8 in_stack_fffffffffffffb80;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffb88;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  CBlock *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  pointer local_3b8;
  pointer local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  assertion_result local_308;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 local_2a0 [24];
  pointer local_288;
  int height;
  uint256 curr_tip;
  BlockValidationState state_1;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_200;
  BlockValidationState state;
  bool newblock;
  undefined1 auStack_187 [15];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  CBlockIndex *pindex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  UniValue result;
  path local_f0;
  path snapshot_path;
  path root;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  undefined1 local_58 [24];
  pointer local_40;
  size_t local_38;
  
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)
       state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p;
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  pcVar20 = "m_node.chainman";
  puVar11 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
                       ,0x47,"test_method","m_node.chainman");
  this_02 = (puVar11->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[1];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0];
  curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[2];
  curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[3];
  curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[4];
  curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[5];
  curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[6];
  curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[7];
  curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[9];
  curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[8];
  curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[10];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,10);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar35 = 0x758fbd;
  file.m_end = (iterator)0x4f;
  file.m_begin = (iterator)&local_2b0;
  msg.m_end = in_R9;
  msg.m_begin = pcVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c0,msg);
  auVar29[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x10] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar29[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x11] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar29[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x12] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar29[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x13] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar29[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x14] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar29[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x15] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar29[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x16] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar29[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x17] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar29[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x18] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar29[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x19] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar29[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar29[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar29[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar29[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar29[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar29[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar25[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[0]);
  auVar25[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[1] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[1]);
  auVar25[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[2] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[2]);
  auVar25[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[3] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[3]);
  auVar25[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[4] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[4]);
  auVar25[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[5] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[5]);
  auVar25[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[6] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[6]);
  auVar25[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[7] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[7]);
  auVar25[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[8] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[8]);
  auVar25[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[9] ==
                curr_tip.super_base_blob<256U>.m_data._M_elems[9]);
  auVar25[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[10] ==
                 curr_tip.super_base_blob<256U>.m_data._M_elems[10]);
  auVar25[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar25[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar25[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar25[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar25[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar25 = auVar25 & auVar29;
  result.typ._0_1_ =
       (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&state_1;
  state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_1db5d09;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_2c8 = "";
  pvVar21 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,_cVar35,(size_t)&local_2d0,
             0x4f);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
  p_Var12->_M_use_count = 1;
  p_Var12->_M_weak_count = 1;
  p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_013aedc0;
  *(undefined2 *)((long)&p_Var12[7]._M_use_count + 1) = 0;
  p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[1]._M_use_count = 0;
  p_Var12[1]._M_weak_count = 0;
  p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[2]._M_use_count = 0;
  p_Var12[2]._M_weak_count = 0;
  p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[3]._M_use_count = 0;
  p_Var12[3]._M_weak_count = 0;
  p_Var12[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[4]._M_use_count = 0;
  p_Var12[4]._M_weak_count = 0;
  p_Var12[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[5]._M_use_count = 0;
  p_Var12[5]._M_weak_count = 0;
  p_Var12[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var12[6]._M_use_count = 0;
  p_Var12[6]._M_weak_count = 0;
  p_Var12[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)(p_Var12 + 6));
  *(undefined2 *)&p_Var12[7]._M_use_count = 0;
  *(undefined1 *)((long)&p_Var12[7]._M_use_count + 2) = 0;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _Var33._M_p = (pointer)p_Var12;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
  pCVar13 = ChainstateManager::ActiveChainstate(this_02);
  block = (CBlock *)(p_Var12 + 1);
  ::node::BlockManager::ReadBlockFromDisk
            (&this_02->m_blockman,block,
             (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x59;
  file_00.m_begin = (iterator)&local_2e0;
  msg_00.m_end = pvVar23;
  msg_00.m_begin = pvVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f0,
             msg_00);
  std::filesystem::__cxx11::path::path
            (&root.super_path,
             &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_path_root.super_path);
  state.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  height = (int)((ulong)((long)(pCVar13->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar13->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  std::filesystem::__cxx11::path::path(&local_f0,&root.super_path);
  tinyformat::format<int>((string *)local_210,"test_snapshot.%d.dat",&height);
  psVar1 = &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
  state_1.super_ValidationState<BlockValidationResult>._0_8_ = psVar1;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&state_1,local_210._0_8_,
             (char *)(local_210._0_8_ + (long)(wrapped_stream *)local_210._8_8_));
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&state,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&state_1,
             auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&state);
  std::filesystem::__cxx11::path::~path((path *)&state);
  if ((size_type *)state_1.super_ValidationState<BlockValidationResult>._0_8_ != psVar1) {
    operator_delete((void *)state_1.super_ValidationState<BlockValidationResult>._0_8_,
                    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                    _M_string_length + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_f0,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,&local_f0);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != &aStack_200) {
    operator_delete((void *)local_210._0_8_,aStack_200._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_f0);
  local_2a0._0_8_ = fsbridge::fopen((char *)&snapshot_path,"wb");
  local_2a0._8_16_ = (undefined1  [16])0x0;
  local_288 = (pointer)0x0;
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&snapshot_path;
  CreateUTXOSnapshot(&result,&(this->super_TestChain100Setup).super_TestingSetup.
                              super_ChainTestingSetup.super_BasicTestingSetup.m_node,pCVar13,
                     (AutoFile *)local_2a0,(path *)pbVar22,(path *)pbVar22);
  pindex = (CBlockIndex *)&local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&pindex,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  ::UniValue::write_abi_cxx11_((UniValue *)&newblock,(int)&result,(void *)0x0,0);
  pLVar14 = LogInstance();
  bVar10 = BCLog::Logger::Enabled(pLVar14);
  if (bVar10) {
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length &
         0xffffffffffffff00;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&state_1,(tinyformat *)"Wrote UTXO snapshot to %s: %s\n",(char *)&pindex,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newblock,
               pbVar22);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state_1);
    if ((size_type *)state_1.super_ValidationState<BlockValidationResult>._0_8_ != psVar1) {
      operator_delete((void *)state_1.super_ValidationState<BlockValidationResult>._0_8_,
                      state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length + 1);
    }
    pLVar14 = LogInstance();
    state_1.super_ValidationState<BlockValidationResult>.m_mode = 0x5f;
    state_1.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
    ;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
    ;
    source_file._M_len = 0x5f;
    str._M_str = (char *)state.super_ValidationState<BlockValidationResult>._0_8_;
    str._M_len = (size_t)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_dataplus._M_p;
    logging_function._M_str = "CreateAndActivateUTXOSnapshot";
    logging_function._M_len = 0x1d;
    BCLog::Logger::LogPrintStr(pLVar14,str,logging_function,source_file,0x35,ALL,Info);
    if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ !=
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length) {
      operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                      state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_newblock != &local_178) {
    operator_delete(_newblock,local_178._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pindex != &local_158) {
    operator_delete(pindex,local_158._M_allocated_capacity + 1);
  }
  local_58._0_8_ = fsbridge::fopen((char *)&snapshot_path,"rb");
  local_58._8_16_ = (undefined1  [16])0x0;
  local_40 = (pointer)0x0;
  MVar4._M_elems =
       *&(((((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).chainparams
          )->pchMessageStart)._M_elems;
  state_1.super_ValidationState<BlockValidationResult>.m_mode._0_2_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)&state_1;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             &state,__l,(less<unsigned_short> *)local_210,(allocator_type *)&criticalblock10);
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._4_4_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_allocated_capacity.
  _1_7_ = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._8_4_ = 0;
  stack0xfffffffffffffe5c = (undefined1  [16])0x0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._0_4_ =
       MVar4._M_elems;
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&state,(AutoFile *)local_58);
  criticalblock10.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock10.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock10.super_unique_lock);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar5 = (pCVar13->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar5 ==
      (pCVar13->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar24 = (CBlockIndex *)0x0;
  }
  else {
    pCVar24 = ppCVar5[-1];
  }
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar6 = (*(pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start)->phashBlock;
  if (puVar6 == (uint256 *)0x0) {
LAB_0075a76d:
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  state_1.super_ValidationState<BlockValidationResult>._0_8_ =
       *(undefined8 *)&puVar6->super_base_blob<256U>;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       *(pointer *)((long)&puVar6->super_base_blob<256U> + 8);
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       *(size_type *)((long)&puVar6->super_base_blob<256U> + 0x10);
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = *(undefined8 *)((long)&puVar6->super_base_blob<256U> + 0x18);
  ChainstateManager::ResetChainstates
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ChainstateManager::InitializeChainstate
            ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
             (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  bVar10 = Chainstate::LoadGenesisBlock(pCVar13);
  local_210[0] = bVar10;
  inline_assertion_check<true,bool>
            ((bool *)local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
             ,0x4f,"CreateAndActivateUTXOSnapshot","chain.LoadGenesisBlock()");
  pindex = (CBlockIndex *)0xf73bdc;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_210,(char **)&pindex,auto_format);
  _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  leveldb_name.super_path._M_pathname._M_string_length = (size_type)this_02;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p = _Var33._M_p;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)block;
  leveldb_name.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffb80;
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffb88._M_head_impl;
  Chainstate::InitCoinsDB(pCVar13,0x100000,true,false,leveldb_name);
  std::filesystem::__cxx11::path::~path((path *)local_210);
  Chainstate::InitCoinsCache(pCVar13,0x100000);
  this_00 = Chainstate::CoinsTip(pCVar13);
  CCoinsViewCache::SetBestBlock(this_00,(uint256 *)&state_1);
  pindex = ::node::BlockManager::LookupBlockIndex
                     (&((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman
                      ,(uint256 *)&state_1);
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              *)&pCVar13->setBlockIndexCandidates,&pindex);
  Chainstate::LoadChainTip(pCVar13);
  ChainstateManager::MaybeRebalanceCaches
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  if (pCVar24 != (CBlockIndex *)0x0) {
    pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (pCVar13->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
    do {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var17._M_pi ==
          pbVar22) {
        pCVar19 = (CBlockIndex *)0x0;
      }
      else {
        pCVar19 = *(CBlockIndex **)
                   ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)_Var17._M_pi + -0x20))->field_2 + 8);
      }
      if (pCVar24 == pCVar19) break;
      if (((pCVar24->nStatus & 0x60) != 0) || ((pCVar24->nStatus & 6) == 0)) {
        __assert_fail("pindex->IsValid(BlockStatus::BLOCK_VALID_TREE)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
                      ,99,
                      "bool CreateAndActivateUTXOSnapshot(TestingSetup *, F, bool, bool) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h:19:27)]"
                     );
      }
      pCVar24->nStatus = 2;
      pCVar24->nTx = 0;
      pCVar24->m_chain_tx_count = 0;
      pCVar24->nSequenceId = 0;
      pCVar24 = pCVar24->pprev;
    } while (pCVar24 != (CBlockIndex *)0x0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  paVar2 = &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state_1.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state_1.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar2;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
       = state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
         _M_allocated_capacity & 0xffffffffffffff00;
  paVar3 = &state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)paVar3;
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  _newblock = (undefined1  [16])0x0;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var17._M_pi;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&newblock;
  bVar10 = Chainstate::ActivateBestChain(pCVar13,&state_1,pblock);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_187._7_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_187._7_8_);
  }
  if (bVar10) {
    criticalblock10.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock10.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock10.super_unique_lock);
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar7 = (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
    pindex = (CBlockIndex *)
             CONCAT71(pindex._1_7_,((long)ppCVar5 - (long)ppCVar7 & 0x7fffffff8U) == 8);
    inline_assertion_check<true,bool>
              ((bool *)&pindex,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
               ,0x70,"CreateAndActivateUTXOSnapshot",
               "0 == WITH_LOCK(node.chainman->GetMutex(), return node.chainman->ActiveHeight())");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        paVar3) {
      operator_delete(state_1.super_ValidationState<BlockValidationResult>.m_debug_message.
                      _M_dataplus._M_p,
                      CONCAT71(state_1.super_ValidationState<BlockValidationResult>.m_debug_message.
                               field_2._M_allocated_capacity._1_7_,
                               state_1.super_ValidationState<BlockValidationResult>.m_debug_message.
                               field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        paVar2) {
      operator_delete(state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_dataplus._M_p,
                      state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                      _M_allocated_capacity + 1);
    }
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar13->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 ==
        (pCVar13->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar24 = (CBlockIndex *)0x0;
    }
    else {
      pCVar24 = ppCVar5[-1];
    }
    if (pCVar24->pprev != (CBlockIndex *)0x0) {
      CChain::SetTip(&pCVar13->m_chain,pCVar24->pprev);
    }
    ChainstateManager::ActivateSnapshot
              ((Result<CBlockIndex_*> *)&state_1,
               (val->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,(AutoFile *)local_58,
               (SnapshotMetadata *)&state,false);
    CChain::SetTip(&pCVar13->m_chain,pCVar24);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1);
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                 *)&state);
    AutoFile::~AutoFile((AutoFile *)local_58);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&result.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result.val._M_dataplus._M_p != &result.val.field_2) {
      operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
    }
    AutoFile::~AutoFile((AutoFile *)local_2a0);
    std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
    _cVar35 = 0x759895;
    std::filesystem::__cxx11::path::~path(&root.super_path);
    local_308.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
          [8] == '\x01');
    local_308.m_message.px = (element_type *)0x0;
    local_308.m_message.pn.pi_ = (sp_counted_base *)0x0;
    result._0_8_ = anon_var_dwarf_1db5d22;
    result.val._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)&result;
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_310 = "";
    pvVar21 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_308,(lazy_ostream *)&state,2,0,WARN,_cVar35,(size_t)&local_318,0x59);
    boost::detail::shared_count::~shared_count(&local_308.m_message.pn);
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x5c;
    file_01.m_begin = (iterator)&local_328;
    msg_01.m_end = pvVar23;
    msg_01.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
               msg_01);
    state.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
    bVar10 = ChainstateManager::IsSnapshotActive(this_02);
    _cVar35 = 0x7599ae;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    result.val._M_dataplus._M_p = (pointer)0x0;
    result.val._M_string_length = 0;
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_1db5d3b;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_340 = "";
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)(_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1;
    result.typ._0_1_ = bVar10;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,_cVar35,
               (size_t)&local_348,0x5c);
    boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
    curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[1];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0];
    curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[2];
    curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[3];
    curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[4];
    curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[5];
    curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[6];
    curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[7];
    curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[9];
    curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[8];
    curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
    TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,1);
    local_358 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_350 = "";
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar35 = 0x759ac1;
    file_02.m_end = (iterator)0x64;
    file_02.m_begin = (iterator)&local_358;
    msg_02.m_end = pvVar23;
    msg_02.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_368,
               msg_02);
    auVar30[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar30[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar30[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar30[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar30[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar30[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar30[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar30[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar30[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar30[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar30[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar30[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar30[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar30[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar30[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar30[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar26[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0]);
    auVar26[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[1] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[1]);
    auVar26[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[2] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[2]);
    auVar26[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[3] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[3]);
    auVar26[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[4] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[4]);
    auVar26[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[5] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[5]);
    auVar26[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[6] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[6]);
    auVar26[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[7] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[7]);
    auVar26[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[8] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[8]);
    auVar26[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[9] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[9]);
    auVar26[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[10] ==
                   curr_tip.super_base_blob<256U>.m_data._M_elems[10]);
    auVar26[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar26[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar26[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar26[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar26[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar26 = auVar26 & auVar30;
    result.typ._0_1_ =
         (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff;
    result.val._M_dataplus._M_p = (pointer)0x0;
    result.val._M_string_length = 0;
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_1db5d09;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    local_378 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_370 = "";
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)(_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,_cVar35,
               (size_t)&local_378,100);
    boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
    curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[1];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0];
    curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[2];
    curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[3];
    curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[4];
    curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[5];
    curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[6];
    curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[7];
    curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[9];
    curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[8];
    curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = &DAT_00000068;
    file_03.m_begin = (iterator)&local_388;
    msg_03.m_end = pvVar23;
    msg_03.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_398,
               msg_03);
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)(state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._1_8_ << 8);
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae088;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    ChainstateManager::GetAll
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&snapshot_path,this_02);
    criticalblock10.super_unique_lock._M_device =
         (mutex_type *)
         ((long)(snapshot_path.super_path._M_pathname._M_string_length -
                (long)snapshot_path.super_path._M_pathname._M_dataplus._M_p) >> 3);
    root.super_path._M_pathname._M_dataplus._M_p._0_1_ =
         snapshot_path.super_path._M_pathname._M_string_length -
         (long)snapshot_path.super_path._M_pathname._M_dataplus._M_p == 0x10;
    local_2a0._0_4_ = 2;
    root.super_path._M_pathname._8_16_ = (undefined1  [16])0x0;
    local_f0._M_pathname._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_f0._M_pathname._M_string_length = 0xf7d053;
    local_210._0_8_ = &criticalblock10;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae0c8;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)local_210;
    local_58._0_8_ = local_2a0;
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013ae248;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar21 = (iterator)0x2;
    result.val.field_2._M_allocated_capacity = (size_type)(AutoFile *)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&root,(lazy_ostream *)&state_1,1,2,REQUIRE,0xf7d23f,
               (size_t)&local_f0,0x68,(lazy_ostream *)&state,"2",&result);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&root.super_path._M_pathname.field_2._M_allocated_capacity);
    this_03 = block;
    if (snapshot_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(snapshot_path.super_path._M_pathname._M_dataplus._M_p,
                      snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity -
                      (long)snapshot_path.super_path._M_pathname._M_dataplus._M_p);
    }
    ChainstateManager::GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&state,this_02)
    ;
    _Var34 = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus;
    plVar18 = (long *)state.super_ValidationState<BlockValidationResult>._0_8_;
    if ((pointer)state.super_ValidationState<BlockValidationResult>._0_8_ ==
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p) {
      pCVar13 = (Chainstate *)0x0;
    }
    else {
      do {
        pCVar13 = (Chainstate *)*plVar18;
        pCVar15 = ChainstateManager::ActiveChainstate(this_02);
        if (pCVar13 != pCVar15) goto LAB_00759dcd;
        plVar18 = plVar18 + 1;
      } while (plVar18 != (long *)_Var34._M_p);
      pCVar13 = (Chainstate *)0x0;
    }
LAB_00759dcd:
    _Var34._M_p = _Var33._M_p;
    if (state.super_ValidationState<BlockValidationResult>._0_8_ != 0) {
      operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                      state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length - state.super_ValidationState<BlockValidationResult>._0_8_);
    }
    result._0_8_ = pCVar13;
    ppCVar16 = inline_assertion_check<true,Chainstate*>
                         ((Chainstate **)&result,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
                          ,0x71,"test_method",
                          "[&]() -> Chainstate* { for (Chainstate* cs : chainman.GetAll()) { if (cs != &chainman.ActiveChainstate()) { return cs; } } return nullptr; }()"
                         );
    pCVar13 = *ppCVar16;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._0_1_ = '\0'
    ;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._1_1_ = '\0'
    ;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._2_1_ = '\0'
    ;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._3_1_ = '\0'
    ;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length._4_4_ = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    pindex = (CBlockIndex *)0x0;
    consensusParams = Params();
    auVar8[0xf] = 0;
    auVar8._0_15_ = auStack_187;
    _newblock = auVar8 << 8;
    root.super_path._M_pathname._M_dataplus._M_p = (pointer)&cs_main;
    auVar9[0xf] = 0;
    auVar9._0_15_ = (undefined1  [15])root.super_path._M_pathname._9_15_;
    root.super_path._M_pathname._8_16_ = auVar9 << 8;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&root);
    pvVar23 = (iterator)0x1;
    bVar10 = CheckBlock(block,&state,&consensusParams->consensus,true,true);
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3a0 = "";
    local_3b8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_3b0 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    _cVar35 = 0x759edc;
    file_04.m_end = (iterator)0x7e;
    file_04.m_begin = (iterator)&local_3a8;
    msg_04.m_end = pvVar21;
    msg_04.m_begin = pvVar23;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3b8,
               msg_04);
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar10;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p = "checked";
    snapshot_path.super_path._M_pathname._M_string_length = (size_type)"";
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013ae1c8;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&snapshot_path;
    local_3c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3c0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,_cVar35,
               (size_t)&local_3c8,0x7e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    result.val._M_dataplus._M_p = _Var33._M_p;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(_Var33._M_p + 8) = *(int *)(_Var33._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(_Var33._M_p + 8) = *(int *)(_Var33._M_p + 8) + 1;
    }
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    result._0_8_ = block;
    bVar10 = ChainstateManager::AcceptBlock
                       (this_02,(shared_ptr<const_CBlock> *)&result,&state,&pindex,true,
                        (FlatFilePos *)0x0,&newblock,true);
    if (result.val._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result.val._M_dataplus._M_p);
    }
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar35 = 0x75a02a;
    file_05.m_end = (iterator)0x81;
    file_05.m_begin = (iterator)&local_3d8;
    msg_05.m_end = pvVar23;
    msg_05.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3e8,
               msg_05);
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar10;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p = "accepted";
    snapshot_path.super_path._M_pathname._M_string_length = (size_type)"";
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013ae1c8;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&snapshot_path;
    local_3f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3f0 = "";
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x81;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,_cVar35,
               (size_t)&local_3f8,0x81);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&root)
    ;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(_Var33._M_p + 8) = *(int *)(_Var33._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(_Var33._M_p + 8) = *(int *)(_Var33._M_p + 8) + 1;
    }
    pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var17._M_pi;
    pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_408;
    local_408 = this_03;
    local_400 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var33._M_p;
    bVar10 = Chainstate::ActivateBestChain(pCVar13,&state,pblock_00);
    if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
    }
    local_418 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_410 = "";
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x88;
    file_06.m_begin = (iterator)&local_418;
    msg_06.m_end = pvVar23;
    msg_06.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
               msg_06);
    root.super_path._M_pathname._M_string_length = root.super_path._M_pathname._9_8_ << 8;
    root.super_path._M_pathname._M_dataplus._M_p = "B";
    root.super_path._M_pathname.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    root.super_path._M_pathname.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    puVar6 = (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar6 == (uint256 *)0x0) goto LAB_0075a76d;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p =
         *(pointer *)(puVar6->super_base_blob<256U>).m_data._M_elems;
    snapshot_path.super_path._M_pathname._8_16_ =
         *(undefined1 (*) [16])((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
    snapshot_path.super_path._M_pathname.field_2._8_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    CBlockHeader::GetHash((uint256 *)&local_f0,&this_03->super_CBlockHeader);
    auVar31[0] = -(local_f0._M_pathname.field_2._M_local_buf[0] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[0]);
    auVar31[1] = -(local_f0._M_pathname.field_2._M_local_buf[1] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[1]);
    auVar31[2] = -(local_f0._M_pathname.field_2._M_local_buf[2] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[2]);
    auVar31[3] = -(local_f0._M_pathname.field_2._M_local_buf[3] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[3]);
    auVar31[4] = -(local_f0._M_pathname.field_2._M_local_buf[4] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[4]);
    auVar31[5] = -(local_f0._M_pathname.field_2._M_local_buf[5] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[5]);
    auVar31[6] = -(local_f0._M_pathname.field_2._M_local_buf[6] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[6]);
    auVar31[7] = -(local_f0._M_pathname.field_2._M_local_buf[7] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[7]);
    auVar31[8] = -(local_f0._M_pathname.field_2._M_local_buf[8] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[8]);
    auVar31[9] = -(local_f0._M_pathname.field_2._M_local_buf[9] ==
                  snapshot_path.super_path._M_pathname.field_2._M_local_buf[9]);
    auVar31[10] = -(local_f0._M_pathname.field_2._M_local_buf[10] ==
                   snapshot_path.super_path._M_pathname.field_2._M_local_buf[10]);
    auVar31[0xb] = -(local_f0._M_pathname.field_2._M_local_buf[0xb] ==
                    snapshot_path.super_path._M_pathname.field_2._M_local_buf[0xb]);
    auVar31[0xc] = -(local_f0._M_pathname.field_2._M_local_buf[0xc] ==
                    snapshot_path.super_path._M_pathname.field_2._M_local_buf[0xc]);
    auVar31[0xd] = -(local_f0._M_pathname.field_2._M_local_buf[0xd] ==
                    snapshot_path.super_path._M_pathname.field_2._M_local_buf[0xd]);
    auVar31[0xe] = -(local_f0._M_pathname.field_2._M_local_buf[0xe] ==
                    snapshot_path.super_path._M_pathname.field_2._M_local_buf[0xe]);
    auVar31[0xf] = -(local_f0._M_pathname.field_2._M_local_buf[0xf] ==
                    snapshot_path.super_path._M_pathname.field_2._M_local_buf[0xf]);
    auVar27[0] = -((char)local_f0._M_pathname._M_dataplus._M_p ==
                  (char)snapshot_path.super_path._M_pathname._M_dataplus._M_p);
    auVar27[1] = -(local_f0._M_pathname._M_dataplus._M_p._1_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._1_1_);
    auVar27[2] = -(local_f0._M_pathname._M_dataplus._M_p._2_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._2_1_);
    auVar27[3] = -(local_f0._M_pathname._M_dataplus._M_p._3_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._3_1_);
    auVar27[4] = -(local_f0._M_pathname._M_dataplus._M_p._4_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._4_1_);
    auVar27[5] = -(local_f0._M_pathname._M_dataplus._M_p._5_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._5_1_);
    auVar27[6] = -(local_f0._M_pathname._M_dataplus._M_p._6_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._6_1_);
    auVar27[7] = -(local_f0._M_pathname._M_dataplus._M_p._7_1_ ==
                  snapshot_path.super_path._M_pathname._M_dataplus._M_p._7_1_);
    auVar27[8] = -((char)local_f0._M_pathname._M_string_length ==
                  (char)snapshot_path.super_path._M_pathname._M_string_length);
    auVar27[9] = -(local_f0._M_pathname._M_string_length._1_1_ ==
                  snapshot_path.super_path._M_pathname._M_string_length._1_1_);
    auVar27[10] = -(local_f0._M_pathname._M_string_length._2_1_ ==
                   snapshot_path.super_path._M_pathname._M_string_length._2_1_);
    auVar27[0xb] = -(local_f0._M_pathname._M_string_length._3_1_ ==
                    snapshot_path.super_path._M_pathname._M_string_length._3_1_);
    auVar27[0xc] = -(local_f0._M_pathname._M_string_length._4_1_ ==
                    snapshot_path.super_path._M_pathname._M_string_length._4_1_);
    auVar27[0xd] = -(local_f0._M_pathname._M_string_length._5_1_ ==
                    snapshot_path.super_path._M_pathname._M_string_length._5_1_);
    auVar27[0xe] = -(local_f0._M_pathname._M_string_length._6_1_ ==
                    snapshot_path.super_path._M_pathname._M_string_length._6_1_);
    auVar27[0xf] = -(local_f0._M_pathname._M_string_length._7_1_ ==
                    snapshot_path.super_path._M_pathname._M_string_length._7_1_);
    auVar27 = auVar27 & auVar31;
    local_210[0] = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
    local_210._8_8_ = (element_type *)0x0;
    aStack_200._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
    local_58._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_58._8_8_ = "";
    criticalblock10.super_unique_lock._M_device = (mutex_type *)&snapshot_path;
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013aed38;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&criticalblock10;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)(state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._1_8_ << 8);
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013aed38;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (size_type)local_2a0;
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x2;
    local_2a0._0_8_ = (FILE *)&local_f0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_210,(lazy_ostream *)&root,1,2,REQUIRE,0xf7d2e7,
               (size_t)local_58,0x88,&result,"pblockone->GetHash()",(assertion_result *)&state_1);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_200._M_allocated_capacity);
    local_438 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar35 = 0x75a350;
    file_07.m_end = (iterator)0x8c;
    file_07.m_begin = (iterator)&local_438;
    msg_07.m_end = pvVar23;
    msg_07.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_448,
               msg_07);
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar10;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    root.super_path._M_pathname._M_dataplus._M_p = "block_added";
    root.super_path._M_pathname._M_string_length = (size_type)"";
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013ae1c8;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_458 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_450 = "";
    pvVar21 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    result.val.field_2._M_allocated_capacity = (size_type)(lazy_ostream *)&root;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,_cVar35,
               (size_t)&local_458,0x8c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    local_468 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_460 = "";
    file_08.m_end = (iterator)0x8d;
    file_08.m_begin = (iterator)&local_468;
    msg_08.m_end = pvVar23;
    msg_08.m_begin = pvVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
               (size_t)&stack0xfffffffffffffb88,msg_08);
    root.super_path._M_pathname._M_string_length = root.super_path._M_pathname._9_8_ << 8;
    root.super_path._M_pathname._M_dataplus._M_p = "B";
    local_210._0_8_ = &curr_tip;
    auVar32[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar32[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar32[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar32[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar32[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar32[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar32[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar32[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar32[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar32[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar32[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar32[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar32[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar32[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar32[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar32[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar28[0] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[0]);
    auVar28[1] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[1] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[1]);
    auVar28[2] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[2] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[2]);
    auVar28[3] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[3] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[3]);
    auVar28[4] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[4] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[4]);
    auVar28[5] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[5] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[5]);
    auVar28[6] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[6] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[6]);
    auVar28[7] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[7] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[7]);
    auVar28[8] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[8] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[8]);
    auVar28[9] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[9] ==
                  curr_tip.super_base_blob<256U>.m_data._M_elems[9]);
    auVar28[10] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[10] ==
                   curr_tip.super_base_blob<256U>.m_data._M_elems[10]);
    auVar28[0xb] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar28[0xc] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar28[0xd] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar28[0xe] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar28[0xf] = -(g_best_block.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf]);
    root.super_path._M_pathname.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    auVar28 = auVar28 & auVar32;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
    root.super_path._M_pathname.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    snapshot_path.super_path._M_pathname._8_16_ = (undefined1  [16])0x0;
    local_f0._M_pathname._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_f0._M_pathname._M_string_length = 0xf7d053;
    result.val._M_dataplus._M_p = (pointer)(result.val._1_8_ << 8);
    result._0_8_ = &PTR__lazy_ostream_013aed38;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)local_210;
    local_58._0_8_ = &g_best_block;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)(state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._1_8_ << 8);
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013aed38;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (size_type)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&snapshot_path,(lazy_ostream *)&root,1,2,REQUIRE,0xf7d0df,
               (size_t)&local_f0,0x8d,&result,"::g_best_block",(assertion_result *)&state_1);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&snapshot_path.super_path._M_pathname.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            field_2._M_allocated_capacity + 1);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var34._M_p);
    if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((string *)&pindex,&state_1.super_ValidationState<BlockValidationResult>);
    tinyformat::format<std::__cxx11::string>
              ((string *)&criticalblock10,(tinyformat *)"ActivateBestChain failed. (%s)",
               (char *)&pindex,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var17._M_pi);
    std::runtime_error::runtime_error(this_01,(string *)&criticalblock10);
    if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstate_update_tip, TestChain100Setup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    uint256 curr_tip = ::g_best_block;

    // Mine 10 more blocks, putting at us height 110 where a valid assumeutxo value can
    // be found.
    mineBlocks(10);

    // After adding some blocks to the tip, best block should have changed.
    BOOST_CHECK(::g_best_block != curr_tip);

    // Grab block 1 from disk; we'll add it to the background chain later.
    std::shared_ptr<CBlock> pblockone = std::make_shared<CBlock>();
    {
        LOCK(::cs_main);
        chainman.m_blockman.ReadBlockFromDisk(*pblockone, *chainman.ActiveChain()[1]);
    }

    BOOST_REQUIRE(CreateAndActivateUTXOSnapshot(
        this, NoMalleation, /*reset_chainstate=*/ true));

    // Ensure our active chain is the snapshot chainstate.
    BOOST_CHECK(WITH_LOCK(::cs_main, return chainman.IsSnapshotActive()));

    curr_tip = ::g_best_block;

    // Mine a new block on top of the activated snapshot chainstate.
    mineBlocks(1);  // Defined in TestChain100Setup.

    // After adding some blocks to the snapshot tip, best block should have changed.
    BOOST_CHECK(::g_best_block != curr_tip);

    curr_tip = ::g_best_block;

    BOOST_CHECK_EQUAL(chainman.GetAll().size(), 2);

    Chainstate& background_cs{*Assert([&]() -> Chainstate* {
        for (Chainstate* cs : chainman.GetAll()) {
            if (cs != &chainman.ActiveChainstate()) {
                return cs;
            }
        }
        return nullptr;
    }())};

    // Append the first block to the background chain.
    BlockValidationState state;
    CBlockIndex* pindex = nullptr;
    const CChainParams& chainparams = Params();
    bool newblock = false;

    // TODO: much of this is inlined from ProcessNewBlock(); just reuse PNB()
    // once it is changed to support multiple chainstates.
    {
        LOCK(::cs_main);
        bool checked = CheckBlock(*pblockone, state, chainparams.GetConsensus());
        BOOST_CHECK(checked);
        bool accepted = chainman.AcceptBlock(
            pblockone, state, &pindex, true, nullptr, &newblock, true);
        BOOST_CHECK(accepted);
    }

    // UpdateTip is called here
    bool block_added = background_cs.ActivateBestChain(state, pblockone);

    // Ensure tip is as expected
    BOOST_CHECK_EQUAL(background_cs.m_chain.Tip()->GetBlockHash(), pblockone->GetHash());

    // g_best_block should be unchanged after adding a block to the background
    // validation chain.
    BOOST_CHECK(block_added);
    BOOST_CHECK_EQUAL(curr_tip, ::g_best_block);
}